

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::MultiBind::DispatchBindImageTexturesTest::iterate(DispatchBindImageTexturesTest *this)

{
  size_t sVar1;
  size_t sVar2;
  GLuint j;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  long lVar5;
  int *piVar6;
  GLint i_1;
  char *pcVar7;
  char *text;
  GLint i;
  char *text_00;
  GLuint value;
  ulong uVar8;
  bool bVar9;
  size_t load_position;
  GLint max_textures;
  DispatchBindImageTexturesTest *local_518;
  size_t sum_position;
  allocator<char> local_502;
  allocator<char> local_501;
  allocator<char> local_500;
  allocator<char> local_4ff;
  allocator<char> local_4fe;
  allocator<char> local_4fd;
  int local_4fc;
  vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> texture;
  long local_4d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_ids;
  Buffer texture_buffer;
  string cs_source;
  Buffer ssb_buffer;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  Program program;
  Functions *gl;
  
  local_518 = this;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  max_textures = 0;
  (*gl->getIntegerv)(0x8f38,&max_textures);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xf84);
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture_buffer.m_id = 0xffffffff;
  texture_buffer.m_context = (Context *)0x0;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_buffer.m_target = 0x8892;
  std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::resize
            (&texture,(long)max_textures);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&texture_ids,(long)max_textures);
  uVar8 = 0;
  iVar3 = 0;
  do {
    if ((long)max_textures <= (long)uVar8) {
      local_4fc = iVar3;
      (*gl->bindImageTextures)
                (0,max_textures,
                 texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"BindImageTextures",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0xfbe);
      ssb_buffer.m_id = 0xffffffff;
      ssb_buffer.m_context = (Context *)0x0;
      ssb_buffer.m_target = 0x8892;
      MultiBind::Buffer::InitData
                (&ssb_buffer,(local_518->super_TestCase).m_context,0x90d2,0x88ea,4,(GLvoid *)0x0);
      MultiBind::Buffer::BindBase(&ssb_buffer,0);
      load_position = 0;
      sum_position = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cs_source,
                 "#version 440 core\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nIMAGE_LIST\nlayout (std140, binding = 0) buffer SSB {\n    uint sum;\n} ssb;\n\nvoid main()\n{\n    uvec4 sum = SUM_LIST;\n    ssb.sum = sum.r\n;}\n\n"
                 ,(allocator<char> *)&program);
      local_4d8 = 0;
      for (uVar8 = 0; sVar2 = sum_position, sVar1 = load_position, (long)uVar8 < (long)max_textures;
          uVar8 = uVar8 + 1) {
        sprintf((char *)&program,"%d",uVar8 & 0xffffffff);
        pcVar7 = "ivec2(0, 0)";
        text_00 = "uimage2D";
        text = "imageLoad(iXXX, COORDS)";
        if (uVar8 < 0xb) {
          pcVar7 = _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE11coordinates_rel
                   + *(int *)(
                             _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE11coordinates_rel
                             + local_4d8);
          text_00 = _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE6images_rel +
                    *(int *)(
                            _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE6images_rel
                            + local_4d8);
          text = _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE7loading_rel +
                 *(int *)(
                         _ZZN6gl4cts9MultiBind29DispatchBindImageTexturesTest7iterateEvE7loading_rel
                         + local_4d8);
        }
        replaceToken("IMAGE_LIST",&load_position,"IMAGE\nIMAGE_LIST",&cs_source);
        load_position = sVar1;
        replaceToken("IMAGE",&load_position,
                     "layout (location = XXX, r32ui) readonly uniform IMAGE iXXX;",&cs_source);
        load_position = sVar1;
        replaceToken("XXX",&load_position,(GLchar *)&program,&cs_source);
        replaceToken("IMAGE",&load_position,text_00,&cs_source);
        replaceToken("XXX",&load_position,(GLchar *)&program,&cs_source);
        replaceToken("SUM_LIST",&sum_position,"LOADING + SUM_LIST",&cs_source);
        sum_position = sVar2;
        replaceToken("LOADING",&sum_position,text,&cs_source);
        sum_position = sVar2;
        replaceToken("XXX",&sum_position,(GLchar *)&program,&cs_source);
        replaceToken("COORDS",&sum_position,pcVar7,&cs_source);
        local_4d8 = local_4d8 + 4;
      }
      replaceToken(" + SUM_LIST",&sum_position,glcts::fixed_sample_locations_values + 1,&cs_source);
      replaceToken("IMAGE_LIST",&load_position,glcts::fixed_sample_locations_values + 1,&cs_source);
      program.m_compute.m_context = (local_518->super_TestCase).m_context;
      program.m_id = 0;
      program.m_compute.m_id = 0;
      program.m_fragment.m_id = 0;
      program.m_geometry.m_id = 0;
      program.m_tess_ctrl.m_id = 0;
      program.m_tess_eval.m_id = 0;
      program.m_vertex.m_id = 0;
      program.m_fragment.m_context = program.m_compute.m_context;
      program.m_geometry.m_context = program.m_compute.m_context;
      program.m_tess_ctrl.m_context = program.m_compute.m_context;
      program.m_tess_eval.m_context = program.m_compute.m_context;
      program.m_vertex.m_context = program.m_compute.m_context;
      program.m_context = program.m_compute.m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,cs_source._M_dataplus._M_p,&local_4fd);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,glcts::fixed_sample_locations_values + 1,&local_4fe);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_418,glcts::fixed_sample_locations_values + 1,&local_4ff);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,glcts::fixed_sample_locations_values + 1,&local_500);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,glcts::fixed_sample_locations_values + 1,&local_501);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,glcts::fixed_sample_locations_values + 1,&local_502);
      MultiBind::Program::Init
                (&program,&local_3d8,&local_3f8,&local_418,&local_438,&local_458,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3d8);
      MultiBind::Program::Use(&program);
      for (iVar3 = 0; iVar3 < max_textures; iVar3 = iVar3 + 1) {
        (*gl->uniform1i)(iVar3,iVar3);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"Uniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                        ,0x1007);
      }
      (*gl->dispatchCompute)(1,1,1);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"DispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x100b);
      (*gl->memoryBarrier)(0xffffffff);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"MemoryBarrier",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x100e);
      piVar6 = (int *)(*gl->mapBuffer)(0x90d2,35000);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"MapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x1011);
      bVar9 = *piVar6 != local_4fc;
      (*gl->unmapBuffer)(0x90d2);
      (*gl->getError)();
      pcVar7 = "Pass";
      if (bVar9 != QP_TEST_RESULT_PASS) {
        pcVar7 = "Fail";
      }
      tcu::TestContext::setTestResult
                (((local_518->super_TestCase).m_context)->m_testCtx,(uint)bVar9,pcVar7);
      MultiBind::Program::~Program(&program);
      std::__cxx11::string::~string((string *)&cs_source);
      MultiBind::Buffer::~Buffer(&ssb_buffer);
      MultiBind::Buffer::~Buffer(&texture_buffer);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::~vector
                (&texture);
      return STOP;
    }
    GVar4 = 0xde1;
    if (uVar8 < 0xb) {
      GVar4 = (&s_texture_infos)[uVar8 * 4];
    }
    for (lVar5 = 0; value = (GLuint)uVar8, lVar5 != 0xd8; lVar5 = lVar5 + 1) {
      (&program.m_id)[lVar5] = value;
    }
    if (GVar4 == 0x8c2a) {
      MultiBind::Buffer::InitData
                (&texture_buffer,(local_518->super_TestCase).m_context,0x8c2a,0x88ea,0x360,&program)
      ;
      MultiBind::Texture::InitBuffer
                (texture.
                 super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,
                 (local_518->super_TestCase).m_context,0x8236,texture_buffer.m_id);
    }
    else {
      if (GVar4 == 0x9100) {
        bVar9 = false;
      }
      else {
        if (GVar4 != 0x9102) {
          MultiBind::Texture::InitStorage
                    (texture.
                     super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar8,
                     (local_518->super_TestCase).m_context,GVar4,1,0x8236,6,6,6,false);
          MultiBind::Texture::Bind
                    (gl,texture.
                        super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar8].m_id,GVar4);
          MultiBind::Texture::SubImage(gl,GVar4,0,0,0,0,6,6,6,0x8d94,0x1405,&program);
          goto LAB_0098aa6c;
        }
        bVar9 = true;
      }
      MultiBind::Texture::InitStorage
                (texture.
                 super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,
                 (local_518->super_TestCase).m_context,GVar4,1,0x8236,6,6,6,false);
      fillMSTexture((local_518->super_TestCase).m_context,
                    texture.
                    super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].m_id,value,bVar9);
    }
LAB_0098aa6c:
    MultiBind::Texture::Bind(gl,0,GVar4);
    iVar3 = iVar3 + value;
    texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8] =
         texture.
         super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar8].m_id;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult DispatchBindImageTexturesTest::iterate()
{
	static const GLchar* cs = "#version 440 core\n"
							  "\n"
							  "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							  "\n"
							  "IMAGE_LIST\n"
							  "layout (std140, binding = 0) buffer SSB {\n"
							  "    uint sum;\n"
							  "} ssb;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    uvec4 sum = SUM_LIST;\n"
							  "    ssb.sum = sum.r\n;"
							  "}\n"
							  "\n";

	static const GLchar* image = "layout (location = XXX, r32ui) readonly uniform IMAGE iXXX;";

	static const GLchar* loading[] = {
		"imageLoad(iXXX, COORDS)", "imageLoad(iXXX, COORDS)",	"imageLoad(iXXX, COORDS)",   "imageLoad(iXXX, COORDS)",
		"imageLoad(iXXX, COORDS)", "imageLoad(iXXX, COORDS)",	"imageLoad(iXXX, COORDS)",   "imageLoad(iXXX, COORDS)",
		"imageLoad(iXXX, COORDS)", "imageLoad(iXXX, COORDS, 0)", "imageLoad(iXXX, COORDS, 0)"
	};

	static const GLchar* images[] = { "uimage1D",	 "uimage1DArray", "uimage2D",		 "uimage2DArray",
									  "uimage3D",	 "uimageBuffer",  "uimageCube",	 "uimageCubeArray",
									  "uimage2DRect", "uimage2DMS",	"uimage2DMSArray" };

	static const GLchar* coordinates[] = {
		"0",
		"ivec2(0, 0)",
		"ivec2(0, 0)",
		"ivec3(0, 0, 0)",
		"ivec3(0, 0, 0)",
		"0",
		"ivec3(0, 0, 0)",
		"ivec3(0, 0, 0)",
		"ivec2(0, 0)",
		"ivec2(0, 0)",
		"ivec3(0, 0, 0)",
	};

	static const GLuint depth  = 6;
	static const GLuint height = 6;
	static const GLuint width  = 6;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLint  max_textures = 0;
	GLuint sum			= 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_IMAGE_UNITS, &max_textures);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Textures */
	/* Storage */
	std::vector<Texture> texture;
	std::vector<GLuint>  texture_ids;
	Buffer				 texture_buffer;

	texture.resize(max_textures);
	texture_ids.resize(max_textures);

	/* Prepare */
	for (GLint i = 0; i < max_textures; ++i)
	{
		const GLenum target = getTarget(i);

		GLuint data[width * height * depth];

		for (GLuint j = 0; j < width * height * depth; ++j)
		{
			data[j] = i;
		}

		sum += i;

		bool is_array = false;

		switch (target)
		{
		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			is_array = true;
		/* Intended pass-through */

		case GL_TEXTURE_2D_MULTISAMPLE:
			texture[i].InitStorage(m_context, target, 1, GL_R32UI, width, height, depth);
			fillMSTexture(m_context, texture[i].m_id, i, is_array);
			break;

		case GL_TEXTURE_BUFFER:
			texture_buffer.InitData(m_context, GL_TEXTURE_BUFFER, GL_DYNAMIC_COPY, sizeof(data), data);
			texture[i].InitBuffer(m_context, GL_R32UI, texture_buffer.m_id);
			break;

		default:
			texture[i].InitStorage(m_context, target, 1, GL_R32UI, width, height, depth);
			Texture::Bind(gl, texture[i].m_id, target);
			Texture::SubImage(gl, target, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, depth,
							  GL_RED_INTEGER, GL_UNSIGNED_INT, &data);
			break;
		}

		/* Clean */
		Texture::Bind(gl, 0, target);

		texture_ids[i] = texture[i].m_id;
	}

	gl.bindImageTextures(0 /* first */, max_textures /* count */, &texture_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTextures");

	/* SSBO */
	Buffer ssb_buffer;
	ssb_buffer.InitData(m_context, GL_SHADER_STORAGE_BUFFER, GL_DYNAMIC_COPY, sizeof(GLuint), 0 /* data */);

	ssb_buffer.BindBase(0);

	/* Prepare program */
	size_t		load_position = 0;
	size_t		sum_position  = 0;
	std::string cs_source	 = cs;
	for (GLint i = 0; i < max_textures; ++i)
	{
		size_t load_start_position = load_position;
		size_t sum_start_position  = sum_position;

		GLchar index[16];

		sprintf(index, "%d", i);

		const GLchar* coords	   = 0;
		const GLchar* image_type   = 0;
		const GLchar* loading_code = 0;

		if (i < (GLint)s_n_texture_tragets)
		{
			coords		 = coordinates[i];
			image_type   = images[i];
			loading_code = loading[i];
		}
		else
		{
			coords		 = coordinates[2]; /* vec2(0.5f, 0.5f) */
			image_type   = images[2];	  /* usampler2D */
			loading_code = loading[2];	 /* texture(sXXX, COORDS) */
		}

		/* Add entry to ubo list */
		replaceToken("IMAGE_LIST", load_position, "IMAGE\nIMAGE_LIST", cs_source);
		load_position = load_start_position;

		replaceToken("IMAGE", load_position, image, cs_source);
		load_position = load_start_position;

		replaceToken("XXX", load_position, index, cs_source);
		replaceToken("IMAGE", load_position, image_type, cs_source);
		replaceToken("XXX", load_position, index, cs_source);

		/* Add entry to sum list */
		replaceToken("SUM_LIST", sum_position, "LOADING + SUM_LIST", cs_source);
		sum_position = sum_start_position;

		replaceToken("LOADING", sum_position, loading_code, cs_source);
		sum_position = sum_start_position;

		replaceToken("XXX", sum_position, index, cs_source);
		replaceToken("COORDS", sum_position, coords, cs_source);
	}

	/* Remove token for lists */
	replaceToken(" + SUM_LIST", sum_position, "", cs_source);
	replaceToken("IMAGE_LIST", load_position, "", cs_source);

	Program program(m_context);
	program.Init(cs_source.c_str(), "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);

	program.Use();

	/* Set images */
	for (GLint i = 0; i < max_textures; ++i)
	{
		gl.uniform1i(i, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");
	}

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

	gl.memoryBarrier(GL_ALL_BARRIER_BITS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

	GLuint* result = (GLuint*)gl.mapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	if (0 != memcmp(result, &sum, sizeof(sum)))
	{
		test_result = false;
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	gl.getError(); /* Ignore error */

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}